

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t attempts_00;
  char *pcVar1;
  typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char> *ptVar2;
  typed_value<unsigned_long,_char> *this;
  size_type sVar3;
  ostream *this_00;
  variable_value *pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  unsigned_long *puVar5;
  error *e;
  string local_258;
  size_t local_238;
  size_t attempts;
  string local_228;
  undefined1 local_208 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> arities;
  key_type local_1e8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a8;
  variables_map local_180 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_170 [144];
  unsigned_long local_e0;
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description description;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,anon_var_dwarf_11a80,&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help,h");
  ptVar2 = boost::program_options::value<std::vector<unsigned_long,std::allocator<unsigned_long>>>()
  ;
  ptVar2 = boost::program_options::
           typed_value<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_char>::multitoken
                     (ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"arity",(char *)ptVar2);
  this = boost::program_options::value<unsigned_long>();
  local_e0 = 1000;
  boost::program_options::typed_value<unsigned_long,_char>::default_value(this,&local_e0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"attempts");
  boost::program_options::variables_map::variables_map(local_180);
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1c8);
  boost::program_options::parse_command_line<char>(&local_1a8,argc,argv,local_98,0,&local_1c8);
  boost::program_options::store((basic_parsed_options *)&local_1a8,local_180,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1c8);
  boost::program_options::notify(local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"help",
             (allocator<char> *)
             ((long)&arities.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_170,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&arities.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"arity",(allocator<char> *)((long)&attempts + 7));
    pvVar4 = boost::program_options::variables_map::operator[](local_180,&local_228);
    __x = boost::program_options::variable_value::
          as<std::vector<unsigned_long,std::allocator<unsigned_long>>>(pvVar4);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,__x);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)((long)&attempts + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"attempts",(allocator<char> *)((long)&e + 7));
    pvVar4 = boost::program_options::variables_map::operator[](local_180,&local_258);
    puVar5 = boost::program_options::variable_value::as<unsigned_long>(pvVar4);
    attempts_00 = *puVar5;
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
    local_238 = attempts_00;
    test<std::vector<unsigned_long,std::allocator<unsigned_long>>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,attempts_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
  }
  else {
    this_00 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  boost::program_options::variables_map::~variables_map(local_180);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка")
        ("arity", bpo::value<std::vector<std::size_t>>()->multitoken(), "Набор кратностей для испытаний")
        ("attempts", bpo::value<std::size_t>()->default_value(1000));

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            std::vector<std::size_t> arities = vm["arity"].as<std::vector<std::size_t>>();
            std::size_t attempts = vm["attempts"].as<std::size_t>();

            test(arities, attempts);
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}